

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astFunctionApplicationNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  size_t i;
  size_t sVar3;
  size_t argumentCount_00;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_f8;
  undefined8 local_e8;
  anon_struct_136_2_7a050327_for_gcRoots *local_e0;
  sysbvm_functionCallFrameStack_t callFrameStack;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = *(sysbvm_tuple_t *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  argumentCount_00 = 0;
  memset(&callFrameStack,0,0xb0);
  local_f8.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_f8.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_f8._12_4_ = 0;
  local_e8 = 0x11;
  local_e0 = &callFrameStack.gcRoots;
  sysbvm_stackFrame_pushRecord(&local_f8);
  uVar1 = *(ulong *)(*arguments + 0x30);
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    argumentCount_00 = (size_t)(*(uint *)(uVar1 + 0xc) >> 3);
  }
  sVar2 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                    (context,*(sysbvm_tuple_t *)(*arguments + 0x28),arguments[1]);
  sysbvm_functionCallFrameStack_begin(context,&callFrameStack,sVar2,argumentCount_00,0);
  for (sVar3 = 0; argumentCount_00 != sVar3; sVar3 = sVar3 + 1) {
    uVar1 = *(ulong *)(*arguments + 0x30);
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      sVar2 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + sVar3 * 8);
    }
    else {
      sVar2 = 0;
    }
    sVar2 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context,sVar2,arguments[1]);
    sysbvm_functionCallFrameStack_push(&callFrameStack,sVar2);
  }
  sysbvm_stackFrame_popRecord(&local_f8);
  sVar2 = sysbvm_functionCallFrameStack_finish(context,&callFrameStack);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_astFunctionApplicationNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astFunctionApplicationNode_t **applicationNode = (sysbvm_astFunctionApplicationNode_t**)node;

    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*applicationNode)->super.sourcePosition);

    sysbvm_functionCallFrameStack_t callFrameStack = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(callFrameStackRecord, callFrameStack.gcRoots);

    size_t applicationArgumentCount = sysbvm_array_getSize((*applicationNode)->arguments);
    sysbvm_functionCallFrameStack_begin(context, &callFrameStack, sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*applicationNode)->functionExpression, *environment), applicationArgumentCount, 0);

    for(size_t i = 0; i < applicationArgumentCount; ++i)
    {
        sysbvm_tuple_t argumentNode = sysbvm_array_at((*applicationNode)->arguments, i);
        sysbvm_functionCallFrameStack_push(&callFrameStack, sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, argumentNode, *environment));
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
    sysbvm_tuple_t result = sysbvm_functionCallFrameStack_finish(context, &callFrameStack);
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    return result;
}